

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar79;
  float fVar80;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_ratan2 op;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  int local_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  int local_3e18;
  undefined8 *local_3e08;
  uint *local_3e00;
  undefined1 (*local_3df8) [32];
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  float local_3a80;
  float fStack_3a7c;
  float fStack_3a78;
  float fStack_3a74;
  float fStack_3a70;
  float fStack_3a6c;
  float fStack_3a68;
  float fStack_3a64;
  float local_3a60;
  float fStack_3a5c;
  float fStack_3a58;
  float fStack_3a54;
  float fStack_3a50;
  float fStack_3a4c;
  float fStack_3a48;
  float fStack_3a44;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  float local_31e0;
  float fStack_31dc;
  float fStack_31d8;
  float fStack_31d4;
  float fStack_31d0;
  float fStack_31cc;
  float fStack_31c8;
  float fStack_31c4;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  float local_2d80;
  float fStack_2d7c;
  float fStack_2d78;
  float fStack_2d74;
  float fStack_2d70;
  float fStack_2d6c;
  float fStack_2d68;
  float fStack_2d64;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float local_2bc0;
  float fStack_2bbc;
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  float local_2b20;
  float fStack_2b1c;
  float fStack_2b18;
  float fStack_2b14;
  float fStack_2b10;
  float fStack_2b0c;
  float fStack_2b08;
  float local_2a80;
  float fStack_2a7c;
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  float local_2a40;
  float fStack_2a3c;
  float fStack_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  float local_29e0;
  float fStack_29dc;
  float fStack_29d8;
  float fStack_29d4;
  float fStack_29d0;
  float fStack_29cc;
  float fStack_29c8;
  float local_2940;
  float fStack_293c;
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float local_2860;
  float fStack_285c;
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  uint local_2580;
  uint uStack_257c;
  uint uStack_2578;
  uint uStack_2574;
  uint uStack_2570;
  uint uStack_256c;
  uint uStack_2568;
  uint uStack_2564;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  float fStack_22a8;
  float fStack_22a4;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  float local_1a40;
  float fStack_1a3c;
  float fStack_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  uint local_de0;
  uint uStack_ddc;
  uint uStack_dd8;
  uint uStack_dd4;
  uint uStack_dd0;
  uint uStack_dcc;
  uint uStack_dc8;
  uint uStack_dc4;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  
  local_3e08 = in_RDX;
  local_3e00 = in_RSI;
  local_3df8 = in_RDI;
  if (in_R8D == 8) {
    for (local_3e18 = 0; local_3e18 < in_ECX; local_3e18 = local_3e18 + 1) {
      uVar1 = *local_3e00;
      auVar13 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x30);
      auVar14 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x30);
      uStack_3cb0 = auVar14._0_8_;
      uStack_3ca8 = auVar14._8_8_;
      auVar78._16_8_ = uStack_3cb0;
      auVar78._0_16_ = auVar13;
      auVar78._24_8_ = uStack_3ca8;
      auVar77._16_8_ = uStack_3cb0;
      auVar77._0_16_ = auVar13;
      auVar77._24_8_ = uStack_3ca8;
      auVar76._16_8_ = uStack_3cb0;
      auVar76._0_16_ = auVar13;
      auVar76._24_8_ = uStack_3ca8;
      auVar7._16_8_ = uStack_3cb0;
      auVar7._0_16_ = auVar13;
      auVar7._24_8_ = uStack_3ca8;
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      auVar14 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x30);
      uStack_2270 = auVar14._0_8_;
      uStack_2268 = auVar14._8_8_;
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
      uStack_2230 = auVar15._0_8_;
      uStack_2228 = auVar15._8_8_;
      auVar15 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
      uStack_21f0 = auVar16._0_8_;
      uStack_21e8 = auVar16._8_8_;
      auVar16 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
      uStack_21b0 = auVar17._0_8_;
      uStack_21a8 = auVar17._8_8_;
      auVar6._16_8_ = uStack_2270;
      auVar6._0_16_ = auVar13;
      auVar6._24_8_ = uStack_2268;
      auVar6 = vcmpps_avx(*local_3df8,auVar6,4);
      auVar2._16_8_ = uStack_2270;
      auVar2._0_16_ = auVar13;
      auVar2._24_8_ = uStack_2268;
      auVar7 = vcmpps_avx(auVar7,auVar2,4);
      auVar6 = vandps_avx(auVar6,auVar7);
      auVar10._16_8_ = uStack_2230;
      auVar10._0_16_ = auVar14;
      auVar10._24_8_ = uStack_2228;
      auVar2 = vandps_avx(auVar10,*local_3df8);
      auVar5._16_8_ = uStack_2230;
      auVar5._0_16_ = auVar14;
      auVar5._24_8_ = uStack_2228;
      auVar3 = vandps_avx(auVar5,auVar76);
      auVar9._16_8_ = uStack_2270;
      auVar9._0_16_ = auVar13;
      auVar9._24_8_ = uStack_2268;
      auVar8 = vcmpps_avx(*local_3df8,auVar9,1);
      auVar9 = vcmpps_avx(auVar77,auVar9,1);
      auVar4._16_8_ = uStack_2230;
      auVar4._0_16_ = auVar14;
      auVar4._24_8_ = uStack_2228;
      auVar9 = vandps_avx(auVar9,auVar4);
      auVar63._16_8_ = uStack_21f0;
      auVar63._0_16_ = auVar15;
      auVar63._24_8_ = uStack_21e8;
      auVar9 = vorps_avx(auVar9,auVar63);
      auVar9 = vandps_avx(auVar8,auVar9);
      auVar12 = vdivps_avx(auVar78,*local_3df8);
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x30);
      uStack_19b0 = auVar17._0_8_;
      uStack_19a8 = auVar17._8_8_;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      uStack_1970 = auVar18._0_8_;
      uStack_1968 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
      uStack_1930 = auVar19._0_8_;
      uStack_1928 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      uStack_18f0 = auVar20._0_8_;
      uStack_18e8 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x30);
      auVar67._16_8_ = uStack_19b0;
      auVar67._0_16_ = auVar14;
      auVar67._24_8_ = uStack_19a8;
      auVar8 = vandps_avx(auVar67,auVar12);
      auVar70._16_8_ = uStack_19b0;
      auVar70._0_16_ = auVar14;
      auVar70._24_8_ = uStack_19a8;
      auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar4 = vandnps_avx(auVar70,auVar12);
      auVar64._16_8_ = uStack_1970;
      auVar64._0_16_ = auVar17;
      auVar64._24_8_ = uStack_1968;
      auVar11 = vcmpps_avx(auVar64,auVar4,1);
      auVar66._16_8_ = uStack_1930;
      auVar66._0_16_ = auVar18;
      auVar66._24_8_ = uStack_1928;
      auVar12 = vandps_avx(auVar11,auVar66);
      auVar5 = vandnps_avx(auVar11,auVar4);
      auVar5 = vorps_avx(auVar12,auVar5);
      auVar12 = vandps_avx(auVar11,auVar4);
      auVar69._16_8_ = uStack_1970;
      auVar69._0_16_ = auVar17;
      auVar69._24_8_ = uStack_1968;
      auVar4 = vandnps_avx(auVar11,auVar69);
      auVar12 = vorps_avx(auVar12,auVar4);
      auVar12 = vdivps_avx(auVar5,auVar12);
      local_15e0 = auVar12._0_4_;
      fStack_15dc = auVar12._4_4_;
      fStack_15d8 = auVar12._8_4_;
      fStack_15d4 = auVar12._12_4_;
      fStack_15d0 = auVar12._16_4_;
      fStack_15cc = auVar12._20_4_;
      fStack_15c8 = auVar12._24_4_;
      fStack_15c4 = auVar12._28_4_;
      fVar79 = local_15e0 * local_15e0;
      fVar83 = fStack_15dc * fStack_15dc;
      fVar85 = fStack_15d8 * fStack_15d8;
      fVar87 = fStack_15d4 * fStack_15d4;
      fVar89 = fStack_15d0 * fStack_15d0;
      fVar91 = fStack_15cc * fStack_15cc;
      fVar93 = fStack_15c8 * fStack_15c8;
      fVar80 = fVar79 * fVar79;
      fVar84 = fVar83 * fVar83;
      fVar86 = fVar85 * fVar85;
      fVar88 = fVar87 * fVar87;
      fVar90 = fVar89 * fVar89;
      fVar92 = fVar91 * fVar91;
      fVar94 = fVar93 * fVar93;
      local_10c0 = auVar34._0_4_;
      fStack_10bc = auVar34._4_4_;
      fStack_10b8 = auVar34._8_4_;
      fStack_10b4 = auVar34._12_4_;
      fStack_10b0 = auVar35._0_4_;
      fStack_10ac = auVar35._4_4_;
      fStack_10a8 = auVar35._8_4_;
      local_1100 = auVar30._0_4_;
      fStack_10fc = auVar30._4_4_;
      fStack_10f8 = auVar30._8_4_;
      fStack_10f4 = auVar30._12_4_;
      fStack_10f0 = auVar31._0_4_;
      fStack_10ec = auVar31._4_4_;
      fStack_10e8 = auVar31._8_4_;
      local_11a0 = auVar26._0_4_;
      fStack_119c = auVar26._4_4_;
      fStack_1198 = auVar26._8_4_;
      fStack_1194 = auVar26._12_4_;
      fStack_1190 = auVar27._0_4_;
      fStack_118c = auVar27._4_4_;
      fStack_1188 = auVar27._8_4_;
      local_1240 = auVar22._0_4_;
      fStack_123c = auVar22._4_4_;
      fStack_1238 = auVar22._8_4_;
      fStack_1234 = auVar22._12_4_;
      fStack_1230 = auVar23._0_4_;
      fStack_122c = auVar23._4_4_;
      fStack_1228 = auVar23._8_4_;
      local_12a0 = auVar36._0_4_;
      fStack_129c = auVar36._4_4_;
      fStack_1298 = auVar36._8_4_;
      fStack_1294 = auVar36._12_4_;
      fStack_1290 = auVar37._0_4_;
      fStack_128c = auVar37._4_4_;
      fStack_1288 = auVar37._8_4_;
      local_12e0 = auVar32._0_4_;
      fStack_12dc = auVar32._4_4_;
      fStack_12d8 = auVar32._8_4_;
      fStack_12d4 = auVar32._12_4_;
      fStack_12d0 = auVar33._0_4_;
      fStack_12cc = auVar33._4_4_;
      fStack_12c8 = auVar33._8_4_;
      local_1380 = auVar28._0_4_;
      fStack_137c = auVar28._4_4_;
      fStack_1378 = auVar28._8_4_;
      fStack_1374 = auVar28._12_4_;
      fStack_1370 = auVar29._0_4_;
      fStack_136c = auVar29._4_4_;
      fStack_1368 = auVar29._8_4_;
      local_1420 = auVar24._0_4_;
      fStack_141c = auVar24._4_4_;
      fStack_1418 = auVar24._8_4_;
      fStack_1414 = auVar24._12_4_;
      fStack_1410 = auVar25._0_4_;
      fStack_140c = auVar25._4_4_;
      fStack_1408 = auVar25._8_4_;
      local_14c0 = auVar20._0_4_;
      fStack_14bc = auVar20._4_4_;
      fStack_14b8 = auVar20._8_4_;
      fStack_14b4 = auVar20._12_4_;
      fStack_14b0 = auVar21._0_4_;
      fStack_14ac = auVar21._4_4_;
      fStack_14a8 = auVar21._8_4_;
      auVar65._16_8_ = uStack_18f0;
      auVar65._0_16_ = auVar19;
      auVar65._24_8_ = uStack_18e8;
      auVar12 = vandps_avx(auVar11,auVar65);
      local_1a40 = auVar12._0_4_;
      fStack_1a3c = auVar12._4_4_;
      fStack_1a38 = auVar12._8_4_;
      fStack_1a34 = auVar12._12_4_;
      fStack_1a30 = auVar12._16_4_;
      fStack_1a2c = auVar12._20_4_;
      fStack_1a28 = auVar12._24_4_;
      fStack_1a24 = auVar12._28_4_;
      auVar68._4_4_ =
           (fVar83 * (fVar84 * (fVar84 * (fVar84 * fStack_10bc + fStack_10fc) + fStack_119c) +
                     fStack_123c) +
           fVar84 * (fVar84 * (fVar84 * (fVar84 * fStack_129c + fStack_12dc) + fStack_137c) +
                    fStack_141c) + fStack_14bc) * fStack_15dc + fStack_1a3c;
      auVar68._0_4_ =
           (fVar79 * (fVar80 * (fVar80 * (fVar80 * local_10c0 + local_1100) + local_11a0) +
                     local_1240) +
           fVar80 * (fVar80 * (fVar80 * (fVar80 * local_12a0 + local_12e0) + local_1380) +
                    local_1420) + local_14c0) * local_15e0 + local_1a40;
      auVar68._8_4_ =
           (fVar85 * (fVar86 * (fVar86 * (fVar86 * fStack_10b8 + fStack_10f8) + fStack_1198) +
                     fStack_1238) +
           fVar86 * (fVar86 * (fVar86 * (fVar86 * fStack_1298 + fStack_12d8) + fStack_1378) +
                    fStack_1418) + fStack_14b8) * fStack_15d8 + fStack_1a38;
      auVar68._12_4_ =
           (fVar87 * (fVar88 * (fVar88 * (fVar88 * fStack_10b4 + fStack_10f4) + fStack_1194) +
                     fStack_1234) +
           fVar88 * (fVar88 * (fVar88 * (fVar88 * fStack_1294 + fStack_12d4) + fStack_1374) +
                    fStack_1414) + fStack_14b4) * fStack_15d4 + fStack_1a34;
      auVar68._16_4_ =
           (fVar89 * (fVar90 * (fVar90 * (fVar90 * fStack_10b0 + fStack_10f0) + fStack_1190) +
                     fStack_1230) +
           fVar90 * (fVar90 * (fVar90 * (fVar90 * fStack_1290 + fStack_12d0) + fStack_1370) +
                    fStack_1410) + fStack_14b0) * fStack_15d0 + fStack_1a30;
      auVar68._20_4_ =
           (fVar91 * (fVar92 * (fVar92 * (fVar92 * fStack_10ac + fStack_10ec) + fStack_118c) +
                     fStack_122c) +
           fVar92 * (fVar92 * (fVar92 * (fVar92 * fStack_128c + fStack_12cc) + fStack_136c) +
                    fStack_140c) + fStack_14ac) * fStack_15cc + fStack_1a2c;
      auVar68._24_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * fStack_10a8 + fStack_10e8) + fStack_1188) +
                     fStack_1228) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * fStack_1288 + fStack_12c8) + fStack_1368) +
                    fStack_1408) + fStack_14a8) * fStack_15c8 + fStack_1a28;
      auVar68._28_4_ = fStack_15c4 + fStack_1a24;
      auVar8 = vorps_avx(auVar68,auVar8);
      local_22c0 = auVar8._0_4_;
      fStack_22bc = auVar8._4_4_;
      fStack_22b8 = auVar8._8_4_;
      fStack_22b4 = auVar8._12_4_;
      fStack_22b0 = auVar8._16_4_;
      fStack_22ac = auVar8._20_4_;
      fStack_22a8 = auVar8._24_4_;
      fStack_22a4 = auVar8._28_4_;
      local_22e0 = auVar9._0_4_;
      fStack_22dc = auVar9._4_4_;
      fStack_22d8 = auVar9._8_4_;
      fStack_22d4 = auVar9._12_4_;
      fStack_22d0 = auVar9._16_4_;
      fStack_22cc = auVar9._20_4_;
      fStack_22c8 = auVar9._24_4_;
      fStack_22c4 = auVar9._28_4_;
      auVar62._16_8_ = uStack_21f0;
      auVar62._0_16_ = auVar15;
      auVar62._24_8_ = uStack_21e8;
      auVar2 = vorps_avx(auVar2,auVar62);
      auVar8._16_8_ = uStack_2270;
      auVar8._0_16_ = auVar13;
      auVar8._24_8_ = uStack_2268;
      auVar9 = vcmpps_avx(auVar2,auVar8,1);
      auVar11._16_8_ = uStack_21b0;
      auVar11._0_16_ = auVar16;
      auVar11._24_8_ = uStack_21a8;
      auVar2 = vorps_avx(auVar3,auVar11);
      auVar2 = vandps_avx(auVar7,auVar2);
      auVar3._16_8_ = uStack_21f0;
      auVar3._0_16_ = auVar15;
      auVar3._24_8_ = uStack_21e8;
      auVar3 = vandps_avx(auVar9,auVar3);
      auVar71._16_8_ = uStack_2270;
      auVar71._0_16_ = auVar13;
      auVar71._24_8_ = uStack_2268;
      auVar9 = vandnps_avx(auVar9,auVar71);
      auVar3 = vorps_avx(auVar3,auVar9);
      auVar3 = vandnps_avx(auVar7,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar12._4_4_ = fStack_22bc + fStack_22dc;
      auVar12._0_4_ = local_22c0 + local_22e0;
      auVar12._12_4_ = fStack_22b4 + fStack_22d4;
      auVar12._8_4_ = fStack_22b8 + fStack_22d8;
      auVar12._20_4_ = fStack_22ac + fStack_22cc;
      auVar12._16_4_ = fStack_22b0 + fStack_22d0;
      auVar12._28_4_ = fStack_22a4 + fStack_22c4;
      auVar12._24_4_ = fStack_22a8 + fStack_22c8;
      auVar2 = vandps_avx(auVar6,auVar12);
      local_de0 = auVar6._0_4_;
      uStack_ddc = auVar6._4_4_;
      uStack_dd8 = auVar6._8_4_;
      uStack_dd4 = auVar6._12_4_;
      uStack_dd0 = auVar6._16_4_;
      uStack_dcc = auVar6._20_4_;
      uStack_dc8 = auVar6._24_4_;
      uStack_dc4 = auVar6._28_4_;
      auVar81._0_4_ = local_de0 ^ auVar10._0_4_;
      auVar81._4_4_ = uStack_ddc ^ auVar10._4_4_;
      auVar81._8_4_ = uStack_dd8 ^ auVar10._8_4_;
      auVar81._12_4_ = uStack_dd4 ^ auVar10._12_4_;
      auVar81._16_4_ = uStack_dd0 ^ auVar10._16_4_;
      auVar81._20_4_ = uStack_dcc ^ auVar10._20_4_;
      auVar81._24_4_ = uStack_dc8 ^ auVar10._24_4_;
      auVar81._28_4_ = uStack_dc4 ^ auVar10._28_4_;
      auVar6 = vandps_avx(auVar81,auVar3);
      auVar6 = vorps_avx(auVar2,auVar6);
      local_3e80 = auVar6._0_8_;
      uStack_3e78 = auVar6._8_8_;
      uStack_3e70 = auVar6._16_8_;
      uStack_3e68 = auVar6._24_8_;
      *local_3e08 = local_3e80;
      local_3e08[1] = uStack_3e78;
      local_3e08[2] = uStack_3e70;
      local_3e08[3] = uStack_3e68;
      local_3df8 = local_3df8 + 1;
      local_3e00 = local_3e00 + 1;
      local_3e08 = local_3e08 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_3e84 = 0; local_3e84 + 1 < in_ECX; local_3e84 = local_3e84 + 2) {
      uVar1 = *local_3e00;
      uVar40 = CONCAT44(uVar1,uVar1);
      uVar41 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3e00[1];
      uVar38 = CONCAT44(uVar1,uVar1);
      uVar39 = CONCAT44(uVar1,uVar1);
      auVar75._8_8_ = uVar41;
      auVar75._0_8_ = uVar40;
      auVar75._16_8_ = uVar38;
      auVar75._24_8_ = uVar39;
      auVar74._8_8_ = uVar41;
      auVar74._0_8_ = uVar40;
      auVar74._16_8_ = uVar38;
      auVar74._24_8_ = uVar39;
      auVar73._8_8_ = uVar41;
      auVar73._0_8_ = uVar40;
      auVar73._16_8_ = uVar38;
      auVar73._24_8_ = uVar39;
      auVar72._8_8_ = uVar41;
      auVar72._0_8_ = uVar40;
      auVar72._16_8_ = uVar38;
      auVar72._24_8_ = uVar39;
      auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
      auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
      auVar14 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0),0x30);
      uStack_3a10 = auVar14._0_8_;
      uStack_3a08 = auVar14._8_8_;
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
      uStack_39d0 = auVar15._0_8_;
      uStack_39c8 = auVar15._8_8_;
      auVar15 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x20);
      auVar15 = vinsertps_avx(auVar15,ZEXT416(0x40490fdb),0x30);
      auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
      uStack_3990 = auVar16._0_8_;
      uStack_3988 = auVar16._8_8_;
      auVar16 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x20);
      auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3fc90fdb),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
      uStack_3950 = auVar17._0_8_;
      uStack_3948 = auVar17._8_8_;
      auVar42._16_8_ = uStack_3a10;
      auVar42._0_16_ = auVar13;
      auVar42._24_8_ = uStack_3a08;
      auVar6 = vcmpps_avx(*local_3df8,auVar42,4);
      auVar43._16_8_ = uStack_3a10;
      auVar43._0_16_ = auVar13;
      auVar43._24_8_ = uStack_3a08;
      auVar7 = vcmpps_avx(auVar72,auVar43,4);
      auVar6 = vandps_avx(auVar6,auVar7);
      auVar50._16_8_ = uStack_39d0;
      auVar50._0_16_ = auVar14;
      auVar50._24_8_ = uStack_39c8;
      auVar2 = vandps_avx(auVar50,*local_3df8);
      auVar49._16_8_ = uStack_39d0;
      auVar49._0_16_ = auVar14;
      auVar49._24_8_ = uStack_39c8;
      auVar3 = vandps_avx(auVar49,auVar73);
      auVar44._16_8_ = uStack_3a10;
      auVar44._0_16_ = auVar13;
      auVar44._24_8_ = uStack_3a08;
      auVar8 = vcmpps_avx(*local_3df8,auVar44,1);
      auVar9 = vcmpps_avx(auVar74,auVar44,1);
      auVar48._16_8_ = uStack_39d0;
      auVar48._0_16_ = auVar14;
      auVar48._24_8_ = uStack_39c8;
      auVar9 = vandps_avx(auVar9,auVar48);
      auVar53._16_8_ = uStack_3990;
      auVar53._0_16_ = auVar15;
      auVar53._24_8_ = uStack_3988;
      auVar9 = vorps_avx(auVar9,auVar53);
      auVar9 = vandps_avx(auVar8,auVar9);
      auVar12 = vdivps_avx(auVar75,*local_3df8);
      auVar14 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x20);
      auVar14 = vinsertps_avx(auVar14,ZEXT416(0x80000000),0x30);
      auVar17 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x80000000),0x30);
      uStack_3150 = auVar17._0_8_;
      uStack_3148 = auVar17._8_8_;
      auVar17 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3f800000),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
      uStack_3110 = auVar18._0_8_;
      uStack_3108 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbf800000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
      uStack_30d0 = auVar19._0_8_;
      uStack_30c8 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3fc90fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      uStack_3090 = auVar20._0_8_;
      uStack_3088 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3f800000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbeaaaa53),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3e4cb974),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbe117200),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3d2edd4e),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbc83a25c),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3b3ac537),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x30);
      auVar57._16_8_ = uStack_3150;
      auVar57._0_16_ = auVar14;
      auVar57._24_8_ = uStack_3148;
      auVar8 = vandps_avx(auVar57,auVar12);
      auVar60._16_8_ = uStack_3150;
      auVar60._0_16_ = auVar14;
      auVar60._24_8_ = uStack_3148;
      auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar4 = vandnps_avx(auVar60,auVar12);
      auVar54._16_8_ = uStack_3110;
      auVar54._0_16_ = auVar17;
      auVar54._24_8_ = uStack_3108;
      auVar11 = vcmpps_avx(auVar54,auVar4,1);
      auVar56._16_8_ = uStack_30d0;
      auVar56._0_16_ = auVar18;
      auVar56._24_8_ = uStack_30c8;
      auVar12 = vandps_avx(auVar11,auVar56);
      auVar5 = vandnps_avx(auVar11,auVar4);
      auVar5 = vorps_avx(auVar12,auVar5);
      auVar12 = vandps_avx(auVar11,auVar4);
      auVar59._16_8_ = uStack_3110;
      auVar59._0_16_ = auVar17;
      auVar59._24_8_ = uStack_3108;
      auVar4 = vandnps_avx(auVar11,auVar59);
      auVar12 = vorps_avx(auVar12,auVar4);
      auVar12 = vdivps_avx(auVar5,auVar12);
      local_2d80 = auVar12._0_4_;
      fStack_2d7c = auVar12._4_4_;
      fStack_2d78 = auVar12._8_4_;
      fStack_2d74 = auVar12._12_4_;
      fStack_2d70 = auVar12._16_4_;
      fStack_2d6c = auVar12._20_4_;
      fStack_2d68 = auVar12._24_4_;
      fStack_2d64 = auVar12._28_4_;
      fVar79 = local_2d80 * local_2d80;
      fVar83 = fStack_2d7c * fStack_2d7c;
      fVar85 = fStack_2d78 * fStack_2d78;
      fVar87 = fStack_2d74 * fStack_2d74;
      fVar89 = fStack_2d70 * fStack_2d70;
      fVar91 = fStack_2d6c * fStack_2d6c;
      fVar93 = fStack_2d68 * fStack_2d68;
      fVar80 = fVar79 * fVar79;
      fVar84 = fVar83 * fVar83;
      fVar86 = fVar85 * fVar85;
      fVar88 = fVar87 * fVar87;
      fVar90 = fVar89 * fVar89;
      fVar92 = fVar91 * fVar91;
      fVar94 = fVar93 * fVar93;
      local_2860 = auVar34._0_4_;
      fStack_285c = auVar34._4_4_;
      fStack_2858 = auVar34._8_4_;
      fStack_2854 = auVar34._12_4_;
      fStack_2850 = auVar35._0_4_;
      fStack_284c = auVar35._4_4_;
      fStack_2848 = auVar35._8_4_;
      local_28a0 = auVar30._0_4_;
      fStack_289c = auVar30._4_4_;
      fStack_2898 = auVar30._8_4_;
      fStack_2894 = auVar30._12_4_;
      fStack_2890 = auVar31._0_4_;
      fStack_288c = auVar31._4_4_;
      fStack_2888 = auVar31._8_4_;
      local_2940 = auVar26._0_4_;
      fStack_293c = auVar26._4_4_;
      fStack_2938 = auVar26._8_4_;
      fStack_2934 = auVar26._12_4_;
      fStack_2930 = auVar27._0_4_;
      fStack_292c = auVar27._4_4_;
      fStack_2928 = auVar27._8_4_;
      local_29e0 = auVar22._0_4_;
      fStack_29dc = auVar22._4_4_;
      fStack_29d8 = auVar22._8_4_;
      fStack_29d4 = auVar22._12_4_;
      fStack_29d0 = auVar23._0_4_;
      fStack_29cc = auVar23._4_4_;
      fStack_29c8 = auVar23._8_4_;
      local_2a40 = auVar36._0_4_;
      fStack_2a3c = auVar36._4_4_;
      fStack_2a38 = auVar36._8_4_;
      fStack_2a34 = auVar36._12_4_;
      fStack_2a30 = auVar37._0_4_;
      fStack_2a2c = auVar37._4_4_;
      fStack_2a28 = auVar37._8_4_;
      local_2a80 = auVar32._0_4_;
      fStack_2a7c = auVar32._4_4_;
      fStack_2a78 = auVar32._8_4_;
      fStack_2a74 = auVar32._12_4_;
      fStack_2a70 = auVar33._0_4_;
      fStack_2a6c = auVar33._4_4_;
      fStack_2a68 = auVar33._8_4_;
      local_2b20 = auVar28._0_4_;
      fStack_2b1c = auVar28._4_4_;
      fStack_2b18 = auVar28._8_4_;
      fStack_2b14 = auVar28._12_4_;
      fStack_2b10 = auVar29._0_4_;
      fStack_2b0c = auVar29._4_4_;
      fStack_2b08 = auVar29._8_4_;
      local_2bc0 = auVar24._0_4_;
      fStack_2bbc = auVar24._4_4_;
      fStack_2bb8 = auVar24._8_4_;
      fStack_2bb4 = auVar24._12_4_;
      fStack_2bb0 = auVar25._0_4_;
      fStack_2bac = auVar25._4_4_;
      fStack_2ba8 = auVar25._8_4_;
      local_2c60 = auVar20._0_4_;
      fStack_2c5c = auVar20._4_4_;
      fStack_2c58 = auVar20._8_4_;
      fStack_2c54 = auVar20._12_4_;
      fStack_2c50 = auVar21._0_4_;
      fStack_2c4c = auVar21._4_4_;
      fStack_2c48 = auVar21._8_4_;
      auVar55._16_8_ = uStack_3090;
      auVar55._0_16_ = auVar19;
      auVar55._24_8_ = uStack_3088;
      auVar12 = vandps_avx(auVar11,auVar55);
      local_31e0 = auVar12._0_4_;
      fStack_31dc = auVar12._4_4_;
      fStack_31d8 = auVar12._8_4_;
      fStack_31d4 = auVar12._12_4_;
      fStack_31d0 = auVar12._16_4_;
      fStack_31cc = auVar12._20_4_;
      fStack_31c8 = auVar12._24_4_;
      fStack_31c4 = auVar12._28_4_;
      auVar58._4_4_ =
           (fVar83 * (fVar84 * (fVar84 * (fVar84 * fStack_285c + fStack_289c) + fStack_293c) +
                     fStack_29dc) +
           fVar84 * (fVar84 * (fVar84 * (fVar84 * fStack_2a3c + fStack_2a7c) + fStack_2b1c) +
                    fStack_2bbc) + fStack_2c5c) * fStack_2d7c + fStack_31dc;
      auVar58._0_4_ =
           (fVar79 * (fVar80 * (fVar80 * (fVar80 * local_2860 + local_28a0) + local_2940) +
                     local_29e0) +
           fVar80 * (fVar80 * (fVar80 * (fVar80 * local_2a40 + local_2a80) + local_2b20) +
                    local_2bc0) + local_2c60) * local_2d80 + local_31e0;
      auVar58._8_4_ =
           (fVar85 * (fVar86 * (fVar86 * (fVar86 * fStack_2858 + fStack_2898) + fStack_2938) +
                     fStack_29d8) +
           fVar86 * (fVar86 * (fVar86 * (fVar86 * fStack_2a38 + fStack_2a78) + fStack_2b18) +
                    fStack_2bb8) + fStack_2c58) * fStack_2d78 + fStack_31d8;
      auVar58._12_4_ =
           (fVar87 * (fVar88 * (fVar88 * (fVar88 * fStack_2854 + fStack_2894) + fStack_2934) +
                     fStack_29d4) +
           fVar88 * (fVar88 * (fVar88 * (fVar88 * fStack_2a34 + fStack_2a74) + fStack_2b14) +
                    fStack_2bb4) + fStack_2c54) * fStack_2d74 + fStack_31d4;
      auVar58._16_4_ =
           (fVar89 * (fVar90 * (fVar90 * (fVar90 * fStack_2850 + fStack_2890) + fStack_2930) +
                     fStack_29d0) +
           fVar90 * (fVar90 * (fVar90 * (fVar90 * fStack_2a30 + fStack_2a70) + fStack_2b10) +
                    fStack_2bb0) + fStack_2c50) * fStack_2d70 + fStack_31d0;
      auVar58._20_4_ =
           (fVar91 * (fVar92 * (fVar92 * (fVar92 * fStack_284c + fStack_288c) + fStack_292c) +
                     fStack_29cc) +
           fVar92 * (fVar92 * (fVar92 * (fVar92 * fStack_2a2c + fStack_2a6c) + fStack_2b0c) +
                    fStack_2bac) + fStack_2c4c) * fStack_2d6c + fStack_31cc;
      auVar58._24_4_ =
           (fVar93 * (fVar94 * (fVar94 * (fVar94 * fStack_2848 + fStack_2888) + fStack_2928) +
                     fStack_29c8) +
           fVar94 * (fVar94 * (fVar94 * (fVar94 * fStack_2a28 + fStack_2a68) + fStack_2b08) +
                    fStack_2ba8) + fStack_2c48) * fStack_2d68 + fStack_31c8;
      auVar58._28_4_ = fStack_2d64 + fStack_31c4;
      auVar8 = vorps_avx(auVar58,auVar8);
      local_3a60 = auVar8._0_4_;
      fStack_3a5c = auVar8._4_4_;
      fStack_3a58 = auVar8._8_4_;
      fStack_3a54 = auVar8._12_4_;
      fStack_3a50 = auVar8._16_4_;
      fStack_3a4c = auVar8._20_4_;
      fStack_3a48 = auVar8._24_4_;
      fStack_3a44 = auVar8._28_4_;
      local_3a80 = auVar9._0_4_;
      fStack_3a7c = auVar9._4_4_;
      fStack_3a78 = auVar9._8_4_;
      fStack_3a74 = auVar9._12_4_;
      fStack_3a70 = auVar9._16_4_;
      fStack_3a6c = auVar9._20_4_;
      fStack_3a68 = auVar9._24_4_;
      fStack_3a64 = auVar9._28_4_;
      auVar52._16_8_ = uStack_3990;
      auVar52._0_16_ = auVar15;
      auVar52._24_8_ = uStack_3988;
      auVar2 = vorps_avx(auVar2,auVar52);
      auVar45._16_8_ = uStack_3a10;
      auVar45._0_16_ = auVar13;
      auVar45._24_8_ = uStack_3a08;
      auVar9 = vcmpps_avx(auVar2,auVar45,1);
      auVar51._16_8_ = uStack_3950;
      auVar51._0_16_ = auVar16;
      auVar51._24_8_ = uStack_3948;
      auVar2 = vorps_avx(auVar3,auVar51);
      auVar2 = vandps_avx(auVar7,auVar2);
      auVar47._16_8_ = uStack_3990;
      auVar47._0_16_ = auVar15;
      auVar47._24_8_ = uStack_3988;
      auVar3 = vandps_avx(auVar9,auVar47);
      auVar61._16_8_ = uStack_3a10;
      auVar61._0_16_ = auVar13;
      auVar61._24_8_ = uStack_3a08;
      auVar9 = vandnps_avx(auVar9,auVar61);
      auVar3 = vorps_avx(auVar3,auVar9);
      auVar3 = vandnps_avx(auVar7,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar46._4_4_ = fStack_3a5c + fStack_3a7c;
      auVar46._0_4_ = local_3a60 + local_3a80;
      auVar46._12_4_ = fStack_3a54 + fStack_3a74;
      auVar46._8_4_ = fStack_3a58 + fStack_3a78;
      auVar46._20_4_ = fStack_3a4c + fStack_3a6c;
      auVar46._16_4_ = fStack_3a50 + fStack_3a70;
      auVar46._28_4_ = fStack_3a44 + fStack_3a64;
      auVar46._24_4_ = fStack_3a48 + fStack_3a68;
      auVar2 = vandps_avx(auVar6,auVar46);
      local_2580 = auVar6._0_4_;
      uStack_257c = auVar6._4_4_;
      uStack_2578 = auVar6._8_4_;
      uStack_2574 = auVar6._12_4_;
      uStack_2570 = auVar6._16_4_;
      uStack_256c = auVar6._20_4_;
      uStack_2568 = auVar6._24_4_;
      uStack_2564 = auVar6._28_4_;
      auVar82._0_4_ = local_2580 ^ auVar10._0_4_;
      auVar82._4_4_ = uStack_257c ^ auVar10._4_4_;
      auVar82._8_4_ = uStack_2578 ^ auVar10._8_4_;
      auVar82._12_4_ = uStack_2574 ^ auVar10._12_4_;
      auVar82._16_4_ = uStack_2570 ^ auVar10._16_4_;
      auVar82._20_4_ = uStack_256c ^ auVar10._20_4_;
      auVar82._24_4_ = uStack_2568 ^ auVar10._24_4_;
      auVar82._28_4_ = uStack_2564 ^ auVar10._28_4_;
      auVar6 = vandps_avx(auVar82,auVar3);
      auVar6 = vorps_avx(auVar2,auVar6);
      local_3f20 = auVar6._0_8_;
      uStack_3f18 = auVar6._8_8_;
      uStack_3f10 = auVar6._16_8_;
      uStack_3f08 = auVar6._24_8_;
      *local_3e08 = local_3f20;
      local_3e08[1] = uStack_3f18;
      local_3e08[2] = uStack_3f10;
      local_3e08[3] = uStack_3f08;
      local_3df8 = local_3df8 + 1;
      local_3e00 = local_3e00 + 2;
      local_3e08 = local_3e08 + 4;
    }
    for (; local_3e84 < in_ECX; local_3e84 = local_3e84 + 1) {
      uVar1 = *local_3e00;
      uVar38 = CONCAT44(uVar1,uVar1);
      uVar39 = CONCAT44(uVar1,uVar1);
      auVar32._8_8_ = uVar39;
      auVar32._0_8_ = uVar38;
      auVar31._8_8_ = uVar39;
      auVar31._0_8_ = uVar38;
      auVar30._8_8_ = uVar39;
      auVar30._0_8_ = uVar38;
      auVar14._8_8_ = uVar39;
      auVar14._0_8_ = uVar38;
      auVar13 = vcmpps_avx(*(undefined1 (*) [16])*local_3df8,ZEXT816(0),4);
      auVar14 = vcmpps_avx(auVar14,ZEXT816(0),4);
      auVar16 = vpand_avx(auVar13,auVar14);
      auVar18._8_8_ = 0x8000000080000000;
      auVar18._0_8_ = 0x8000000080000000;
      auVar17 = vpand_avx(auVar18,*(undefined1 (*) [16])*local_3df8);
      auVar15._8_8_ = 0x8000000080000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar18 = vpand_avx(auVar15,auVar30);
      auVar13 = vcmpps_avx(*(undefined1 (*) [16])*local_3df8,ZEXT816(0),1);
      auVar15 = vcmpps_avx(auVar31,ZEXT816(0),1);
      auVar19._8_8_ = 0x8000000080000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar15 = vpand_avx(auVar15,auVar19);
      auVar22._8_8_ = 0x40490fdb40490fdb;
      auVar22._0_8_ = 0x40490fdb40490fdb;
      auVar15 = vpor_avx(auVar15,auVar22);
      auVar19 = vpand_avx(auVar13,auVar15);
      auVar13 = vdivps_avx(auVar32,*(undefined1 (*) [16])*local_3df8);
      auVar23._8_8_ = 0x8000000080000000;
      auVar23._0_8_ = 0x8000000080000000;
      auVar20 = vpand_avx(auVar23,auVar13);
      auVar29._8_8_ = 0x8000000080000000;
      auVar29._0_8_ = 0x8000000080000000;
      auVar23 = vpcmpeqd_avx(auVar22,auVar22);
      auVar21 = vpandn_avx(auVar29,auVar13);
      auVar27._8_8_ = 0x3f8000003f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar13 = vcmpps_avx(auVar27,auVar21,1);
      auVar25._8_8_ = 0xbf800000bf800000;
      auVar25._0_8_ = 0xbf800000bf800000;
      auVar15 = vpand_avx(auVar13,auVar25);
      auVar22 = vpandn_avx(auVar13,auVar21);
      auVar22 = vpor_avx(auVar15,auVar22);
      auVar15 = vpand_avx(auVar13,auVar21);
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar21 = vpandn_avx(auVar13,auVar28);
      auVar15 = vpor_avx(auVar15,auVar21);
      auVar15 = vdivps_avx(auVar22,auVar15);
      local_6d0 = auVar15._0_4_;
      fStack_6cc = auVar15._4_4_;
      fStack_6c8 = auVar15._8_4_;
      fStack_6c4 = auVar15._12_4_;
      fVar79 = local_6d0 * local_6d0;
      fVar83 = fStack_6cc * fStack_6cc;
      fVar85 = fStack_6c8 * fStack_6c8;
      fVar87 = fStack_6c4 * fStack_6c4;
      fVar80 = fVar79 * fVar79;
      fVar84 = fVar83 * fVar83;
      fVar86 = fVar85 * fVar85;
      fVar88 = fVar87 * fVar87;
      auVar24._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar13 = vpand_avx(auVar13,auVar24);
      local_740 = auVar13._0_4_;
      fStack_73c = auVar13._4_4_;
      fStack_738 = auVar13._8_4_;
      fStack_734 = auVar13._12_4_;
      auVar26._4_4_ =
           (fVar83 * (fVar84 * (fVar84 * (fVar84 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar84 * (fVar84 * (fVar84 * (fVar84 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6cc + fStack_73c;
      auVar26._0_4_ =
           (fVar79 * (fVar80 * (fVar80 * (fVar80 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar80 * (fVar80 * (fVar80 * (fVar80 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * local_6d0 + local_740;
      auVar26._8_4_ =
           (fVar85 * (fVar86 * (fVar86 * (fVar86 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar86 * (fVar86 * (fVar86 * (fVar86 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6c8 + fStack_738;
      auVar26._12_4_ =
           (fVar87 * (fVar88 * (fVar88 * (fVar88 * -0.01606863 + -0.07504295) + -0.14203644) +
                     -0.33333072) +
           fVar88 * (fVar88 * (fVar88 * (fVar88 * 0.0028498897 + 0.04269152) + 0.10640934) +
                    0.1999262) + 1.0) * fStack_6c4 + fStack_734;
      auVar13 = vpor_avx(auVar26,auVar20);
      local_c20 = auVar13._0_4_;
      fStack_c1c = auVar13._4_4_;
      fStack_c18 = auVar13._8_4_;
      fStack_c14 = auVar13._12_4_;
      local_c30 = auVar19._0_4_;
      fStack_c2c = auVar19._4_4_;
      fStack_c28 = auVar19._8_4_;
      fStack_c24 = auVar19._12_4_;
      auVar21._8_8_ = 0x40490fdb40490fdb;
      auVar21._0_8_ = 0x40490fdb40490fdb;
      auVar13 = vpor_avx(auVar17,auVar21);
      auVar13 = vcmpps_avx(auVar13,ZEXT816(0),1);
      auVar20._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar20._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar15 = vpor_avx(auVar18,auVar20);
      auVar15 = vpand_avx(auVar14,auVar15);
      auVar17._8_8_ = 0x40490fdb40490fdb;
      auVar17._0_8_ = 0x40490fdb40490fdb;
      auVar17 = vpand_avx(auVar13,auVar17);
      auVar13 = vpandn_avx(auVar13,ZEXT816(0));
      auVar13 = vpor_avx(auVar17,auVar13);
      auVar13 = vpandn_avx(auVar14,auVar13);
      auVar14 = vpor_avx(auVar15,auVar13);
      auVar13._4_4_ = fStack_c1c + fStack_c2c;
      auVar13._0_4_ = local_c20 + local_c30;
      auVar13._12_4_ = fStack_c14 + fStack_c24;
      auVar13._8_4_ = fStack_c18 + fStack_c28;
      auVar13 = vpand_avx(auVar16,auVar13);
      auVar14 = vpand_avx(auVar16 ^ auVar23,auVar14);
      auVar13 = vpor_avx(auVar13,auVar14);
      local_3f50 = auVar13._0_8_;
      uStack_3f48 = auVar13._8_8_;
      *local_3e08 = local_3f50;
      local_3e08[1] = uStack_3f48;
      local_3df8 = (undefined1 (*) [32])(*local_3df8 + 0x10);
      local_3e00 = local_3e00 + 1;
      local_3e08 = local_3e08 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}